

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O1

uint8_t hex8_to_digest(char *data)

{
  char cVar1;
  char cVar2;
  char cVar3;
  
  cVar2 = *data;
  cVar1 = '0';
  if ((((cVar2 < ':') || (cVar1 = '7', cVar2 < 'G')) || (cVar1 = 'W', cVar2 < 'g')) &&
     (cVar1 <= cVar2)) {
    cVar2 = (cVar2 - cVar1) * '\x10';
  }
  else {
    cVar2 = '\0';
  }
  cVar1 = data[1];
  cVar3 = '0';
  if ((((cVar1 < ':') || (cVar3 = '7', cVar1 < 'G')) || (cVar3 = 'W', cVar1 < 'g')) &&
     (cVar3 <= cVar1)) {
    cVar1 = cVar1 - cVar3;
  }
  else {
    cVar1 = '\0';
  }
  return cVar1 + cVar2;
}

Assistant:

static uint8_t hex8_to_digest(const char data[2])
{
	return (hex4_to_digest(data[0]) * 16) + hex4_to_digest(data[1]);
}